

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_intlog.cpp
# Opt level: O2

void __thiscall
bitmanip::anon_unknown_0::Test_intlog_log2floor_debruijn_forPow2_::run
          (Test_intlog_log2floor_debruijn_forPow2_ *this)

{
  SourceLocation loc;
  ulong uVar1;
  string_view msg;
  uint32_t local_f4;
  ulong local_f0;
  char *local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_50;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_30;
  
  uVar1 = 1;
  while( true ) {
    if (uVar1 == 0x20) {
      return;
    }
    local_f4 = log2floor_debruijn(1 << ((byte)uVar1 & 0x1f));
    if (uVar1 != local_f4) break;
    uVar1 = uVar1 + 1;
  }
  local_f0 = uVar1;
  stringify<unsigned_int>(&local_30,&local_f4);
  std::operator+(&local_b0,
                 "Comparison failed: log2_floor_32(std::uint32_t{1} << i) == i (with \"log2_floor_32(std::uint32_t{1} << i)\"="
                 ,&local_30);
  std::operator+(&local_90,&local_b0,", \"i\"=");
  stringify<unsigned_long>(&local_50,&local_f0);
  std::operator+(&local_70,&local_90,&local_50);
  std::operator+(&local_d0,&local_70,")");
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
  pcStack_e0 = "test_log2_floor_forPow2";
  local_d8 = 0xc;
  loc.function = "test_log2_floor_forPow2";
  loc.file = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
  loc.line = 0xc;
  msg._M_str = local_d0._M_dataplus._M_p;
  msg._M_len = local_d0._M_string_length;
  assertFail(msg,loc);
}

Assistant:

BITMANIP_TEST(intlog, log2floor_debruijn_forPow2)
{
    test_log2_floor_forPow2<log2floor_debruijn>();
}